

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

void __thiscall stream::slice_reader::seek(slice_reader *this,size_t slice)

{
  slice_error *this_00;
  bool bVar1;
  int in_EDX;
  int extraout_EDX;
  allocator<char> local_39;
  string local_38;
  
  if (this->current_slice == slice) {
    bVar1 = is_open(this);
    in_EDX = extraout_EDX;
    if (bVar1) {
      return;
    }
  }
  if (this->data_offset == 0) {
    open(this,(char *)slice,in_EDX);
    return;
  }
  this_00 = (slice_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"cannot change slices in single-file setup",&local_39);
  slice_error::slice_error(this_00,&local_38);
  __cxa_throw(this_00,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void slice_reader::seek(size_t slice) {
	
	if(slice == current_slice && is_open()) {
		return;
	}
	
	if(data_offset != 0) {
		throw slice_error("cannot change slices in single-file setup");
	}
	
	open(slice);
}